

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

void __thiscall
opt_dereferenceOperatorRvalue_Test::~opt_dereferenceOperatorRvalue_Test
          (opt_dereferenceOperatorRvalue_Test *this)

{
  opt_dereferenceOperatorRvalue_Test *this_local;
  
  ~opt_dereferenceOperatorRvalue_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(opt, dereferenceOperatorRvalue)
{
  weekday::underlying_type d{1};
  auto make = [&] { return opt<weekday>{d}; };
  EXPECT_TRUE(make());
  EXPECT_TRUE(make().has_value());
  EXPECT_EQ(d, *make());
  EXPECT_EQ(d, make().value());
  EXPECT_EQ(d, make()->get());
  EXPECT_EQ(d, make().value_or(weekday::underlying_type{3}));
}